

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O1

void __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
RemoveLast(RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  int iVar1;
  undefined8 *puVar2;
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if ((this->super_RepeatedPtrFieldBase).current_size_ < 1) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x397);
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: (current_size_) > (0): ");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage(&local_50);
  }
  iVar1 = (this->super_RepeatedPtrFieldBase).current_size_;
  (this->super_RepeatedPtrFieldBase).current_size_ = iVar1 + -1;
  puVar2 = (undefined8 *)((this->super_RepeatedPtrFieldBase).rep_)->elements[(long)iVar1 + -1];
  puVar2[1] = 0;
  *(undefined1 *)*puVar2 = 0;
  return;
}

Assistant:

inline void RepeatedPtrField<Element>::RemoveLast() {
  RepeatedPtrFieldBase::RemoveLast<TypeHandler>();
}